

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMatch.c
# Opt level: O0

float Amap_ManComputeMapping(Amap_Man_t *p)

{
  int iVar1;
  Amap_Obj_t *pObj_00;
  Amap_Obj_t *pObj_01;
  float fVar2;
  int local_20;
  float local_1c;
  int i;
  float Area;
  Amap_Obj_t *pObj;
  Amap_Man_t *p_local;
  
  local_1c = 0.0;
  Amap_ManCleanRefs(p);
  for (local_20 = 0; iVar1 = Vec_PtrSize(p->vPos), local_20 < iVar1; local_20 = local_20 + 1) {
    pObj_00 = (Amap_Obj_t *)Vec_PtrEntry(p->vPos,local_20);
    pObj_01 = Amap_ObjFanin0(p,pObj_00);
    iVar1 = Amap_ObjFaninC0(pObj_00);
    fVar2 = Amap_ManComputeMapping_rec(p,pObj_01,iVar1);
    local_1c = fVar2 + local_1c;
  }
  return local_1c;
}

Assistant:

float Amap_ManComputeMapping( Amap_Man_t * p )
{
    Amap_Obj_t * pObj;
    float Area = 0.0;
    int i;
    Amap_ManCleanRefs( p );
    Amap_ManForEachPo( p, pObj, i )
        Area += Amap_ManComputeMapping_rec( p, Amap_ObjFanin0(p, pObj), Amap_ObjFaninC0(pObj) );
    return Area;
}